

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void deqp::egl::requireEGLExtension(Library *egl,EGLDisplay eglDisplay,char *requiredExtension)

{
  bool bVar1;
  NotSupportedError *this;
  char *pcVar2;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *requiredExtension_local;
  EGLDisplay eglDisplay_local;
  Library *egl_local;
  
  local_20 = requiredExtension;
  requiredExtension_local = (char *)eglDisplay;
  eglDisplay_local = egl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,requiredExtension,&local_41);
  bVar1 = eglu::hasExtension(egl,eglDisplay,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  pcVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar2,&local_99);
  std::operator+(&local_78,&local_98," not supported");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (this,pcVar2,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x7e2);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

static void requireEGLExtension (const Library& egl, EGLDisplay eglDisplay, const char* requiredExtension)
{
	if (!eglu::hasExtension(egl, eglDisplay, requiredExtension))
		TCU_THROW(NotSupportedError, (string(requiredExtension) + " not supported").c_str());
}